

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O0

void __thiscall Refal2::CArbitraryInteger::Add(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  bool bVar1;
  bool bVar2;
  CArbitraryInteger *operand_local;
  CArbitraryInteger *this_local;
  
  removeLeadingZeros(this);
  removeLeadingZeros(operand);
  bVar1 = IsNegative(this);
  bVar2 = IsNegative(operand);
  if (bVar1 == bVar2) {
    add(this,operand);
  }
  else {
    sub(this,operand);
  }
  removeLeadingZeros(this);
  return;
}

Assistant:

void CArbitraryInteger::Add( const CArbitraryInteger& operand )
{
	removeLeadingZeros();
	const_cast<CArbitraryInteger&>( operand ).removeLeadingZeros();
	if( IsNegative() == operand.IsNegative() ) {
		// result sign will be the same of operands
		add( operand );
	} else {
		sub( operand );
	}
	removeLeadingZeros();
}